

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::ClearEdgeMarks(ON_SubDVertex *this)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->m_edge_count;
  if (uVar1 == 0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    uVar4 = 0;
    do {
      uVar3 = this->m_edges[uVar4].m_ptr & 0xfffffffffffffff8;
      if (uVar3 == 0) {
        bVar2 = false;
      }
      else {
        ON_ComponentStatus::ClearRuntimeMark((ON_ComponentStatus *)(uVar3 + 0x10));
        uVar1 = this->m_edge_count;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
  }
  return bVar2;
}

Assistant:

bool ON_SubDVertex::ClearEdgeMarks() const
{
  bool rc = true;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      rc = false;
    else
      e->m_status.ClearRuntimeMark();
  }
  return rc;
}